

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanillaSynapseBuilder.cpp
# Opt level: O2

ISynapse * __thiscall
VanillaSynapseBuilder::Build
          (VanillaSynapseBuilder *this,size_t layerSize,size_t nextLayerSize,INeuron *prev,
          INeuron *next)

{
  BasicSynapse *this_00;
  result_type _strength;
  uniform_real_distribution<float> distribution;
  
  distribution._M_param._M_b = SQRT(3.0 / (float)nextLayerSize);
  distribution._M_param._M_a = 0.0;
  this_00 = (BasicSynapse *)operator_new(0x40);
  _strength = std::uniform_real_distribution<float>::operator()
                        (&distribution,(this->super_ISynapseBuilder).generator);
  BasicSynapse::BasicSynapse
            (this_00,(bool)(undefined1)ISynapse::DEFAULT_SYNAPSE_UPDATABILITY,_strength,
             (Time)ISynapse::DEFAULT_SYNAPSE_DELAY,prev,next);
  return &this_00->super_ISynapse;
}

Assistant:

ISynapse *VanillaSynapseBuilder::Build( size_t layerSize, size_t nextLayerSize, INeuron *prev, INeuron *next ) const
{
//    3 stands for some fixed constant from the article
    float limit = sqrt( 3.f / ( static_cast<float>( nextLayerSize )));
    std::uniform_real_distribution<float> distribution( 0, limit );
    return new BasicSynapse(
            ISynapse::DEFAULT_SYNAPSE_UPDATABILITY,
            distribution( generator ),
            ISynapse::DEFAULT_SYNAPSE_DELAY,
            prev, next );
}